

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::verify
          (LinearDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *scale;
  ostringstream *poVar1;
  float fVar2;
  Precision PVar3;
  Vec4 *pVVar4;
  ulong uVar5;
  bool bVar6;
  int i;
  int i_2;
  DataType DVar7;
  long lVar8;
  undefined7 extraout_var;
  undefined8 uVar9;
  RenderTarget *pRVar10;
  undefined7 extraout_var_00;
  int iVar11;
  long lVar12;
  EVP_PKEY_CTX *pEVar13;
  long lVar14;
  int iVar15;
  MessageBuilder *this_00;
  uint uVar16;
  float fVar17;
  float fVar18;
  undefined4 uVar19;
  Vector<float,_3> res_13;
  float fStack_25c;
  Vector<float,_2> res_8;
  Vec4 threshold;
  Vec4 reference;
  Vector<float,_4> res;
  Vec4 opThreshold;
  float local_1fc [3];
  PixelBufferAccess *local_1f0;
  Vec4 surfaceThreshold;
  Vec4 yScale;
  Vec4 xScale;
  Vector<float,_4> res_3;
  ios_base local_140 [272];
  
  uVar5 = stack0xfffffffffffffda0;
  xScale.m_data[0] = 1.0;
  xScale.m_data[1] = 0.0;
  xScale.m_data[2] = 0.5;
  xScale.m_data[3] = -0.5;
  yScale.m_data[0] = 0.0;
  yScale.m_data[1] = 1.0;
  yScale.m_data[2] = 0.5;
  yScale.m_data[3] = -0.5;
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)&res_3);
  scale = &(this->super_TriangleDerivateCase).m_derivScale;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    fVar17 = scale->m_data[lVar8];
    fVar18 = -fVar17;
    if (-fVar17 <= fVar17) {
      fVar18 = fVar17;
    }
    res.m_data[lVar8] = fVar18;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  surfaceThreshold.m_data[0] = 0.0;
  surfaceThreshold.m_data[1] = 0.0;
  surfaceThreshold.m_data[2] = 0.0;
  surfaceThreshold.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    surfaceThreshold.m_data[lVar8] = res_3.m_data[lVar8] / res.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  uVar16 = *(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (uVar16 < 2) {
    pEVar13 = ctx + 0xc;
    pVVar4 = &yScale;
    if (uVar16 == 0) {
      pEVar13 = ctx + 8;
      pVVar4 = &xScale;
    }
    iVar15 = *(int *)pEVar13;
    res.m_data._0_8_ = *(undefined8 *)pVVar4->m_data;
    res.m_data._8_8_ = *(undefined8 *)(pVVar4->m_data + 2);
    opThreshold.m_data[0] = 0.0;
    opThreshold.m_data[1] = 0.0;
    opThreshold.m_data[2] = 0.0;
    opThreshold.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      opThreshold.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar8] -
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    res_3.m_data[2] = 0.0;
    res_3.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      res_3.m_data[lVar8] = opThreshold.m_data[lVar8] / (float)iVar15;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      reference.m_data[lVar8] = res_3.m_data[lVar8] * res.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    PVar3 = (this->super_TriangleDerivateCase).m_precision;
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    res_3.m_data[2] = 0.0;
    res_3.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      res_3.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar8] * res.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    threshold.m_data[0] = 0.0;
    threshold.m_data[1] = 0.0;
    threshold.m_data[2] = 0.0;
    threshold.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      threshold.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar8] * res.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    getDerivateThreshold((Functional *)&opThreshold,PVar3,&res_3,&threshold,&reference);
    threshold.m_data[0] = 0.0;
    threshold.m_data[1] = 0.0;
    threshold.m_data[2] = 0.0;
    threshold.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      uVar16 = -(uint)(opThreshold.m_data[lVar8] <= surfaceThreshold.m_data[lVar8]);
      threshold.m_data[lVar8] =
           (float)(~uVar16 & (uint)opThreshold.m_data[lVar8] |
                  (uint)surfaceThreshold.m_data[lVar8] & uVar16);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    DVar7 = glu::getDataTypeFloatScalars((this->super_TriangleDerivateCase).m_dataType);
    res_3.m_data._0_8_ =
         ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    poVar1 = (ostringstream *)(res_3.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying result image.\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tValid derivative is ",0x15);
    if (DVar7 == TYPE_FLOAT_VEC3) {
      res_8.m_data[0] = reference.m_data[0];
      res_8.m_data[1] = reference.m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_8);
    }
    else if (DVar7 == TYPE_FLOAT_VEC2) {
      res_8.m_data[0] = reference.m_data[0];
      res_8.m_data[1] = reference.m_data[1];
      tcu::operator<<((ostream *)poVar1,&res_8);
    }
    else if (DVar7 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)reference.m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,&reference);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with threshold ",0x10);
    local_1f0 = (PixelBufferAccess *)sig;
    if (DVar7 == TYPE_FLOAT_VEC3) {
      res_8.m_data[0] = threshold.m_data[0];
      res_8.m_data[1] = threshold.m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_8);
    }
    else if (DVar7 == TYPE_FLOAT_VEC2) {
      res_8.m_data[0] = threshold.m_data[0];
      res_8.m_data[1] = threshold.m_data[1];
      tcu::operator<<((ostream *)poVar1,&res_8);
    }
    else if (DVar7 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)threshold.m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,&threshold);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res_3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    pVVar4 = &(this->super_TriangleDerivateCase).m_derivBias;
    bVar6 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,local_1f0,
                       (this->super_TriangleDerivateCase).m_dataType,&reference,&threshold,scale,
                       pVVar4,LOG_NOTHING);
    if (bVar6) {
      res_3.m_data._0_8_ =
           ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = (ostringstream *)(res_3.m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"No incorrect derivatives found, result valid.",0x2d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res_3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      uVar9 = std::ios_base::~ios_base(local_140);
      iVar15 = (int)CONCAT71((int7)((ulong)uVar9 >> 8),1);
    }
    else {
      res_3.m_data._0_8_ =
           ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = (ostringstream *)(res_3.m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "\tVerifying each result derivative is within its range of legal result values.",
                 0x4d);
      this_00 = (MessageBuilder *)&res_3;
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
        pRVar10 = Context::getRenderTarget
                            ((this->super_TriangleDerivateCase).super_TestCase.m_context);
        iVar15 = 0xa7;
        if (pRVar10->m_width < 0xa7) {
          iVar15 = pRVar10->m_width;
        }
        pRVar10 = Context::getRenderTarget
                            ((this->super_TriangleDerivateCase).super_TestCase.m_context);
        iVar11 = 0x67;
        if (pRVar10->m_height < 0x67) {
          iVar11 = pRVar10->m_height;
        }
        fVar18 = (float)iVar15;
        fVar17 = (float)iVar11;
      }
      else {
        fVar18 = 99.0;
        fVar17 = 133.0;
      }
      res_8.m_data[0] = 0.0;
      res_8.m_data[1] = 0.0;
      lVar8 = 0;
      do {
        res_8.m_data[lVar8] =
             (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar8] -
             (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      res_3.m_data[0] = 0.0;
      res_3.m_data[1] = 0.0;
      res_3.m_data[2] = 0.0;
      res_3.m_data[3] = 0.0;
      lVar8 = 0;
      lVar12 = 0;
      do {
        lVar14 = 0;
        do {
          uVar19 = 0x3f800000;
          if (lVar8 != lVar14) {
            uVar19 = 0;
          }
          *(undefined4 *)((long)&this_00->m_log + lVar14) = uVar19;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0x30);
        lVar12 = lVar12 + 1;
        this_00 = (MessageBuilder *)((long)&this_00->m_log + 4);
        lVar8 = lVar8 + 0x10;
      } while (lVar12 != 4);
      res_13.m_data[1] = 0.0;
      res_13.m_data[0] = res_8.m_data[0] / fVar18;
      res_13.m_data[2] = (this->super_TriangleDerivateCase).m_coordMin.m_data[0];
      lVar8 = 0;
      do {
        res_3.m_data[lVar8] = *(float *)((long)res_13.m_data + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xc);
      res_13.m_data._0_8_ = (ulong)(uint)(res_8.m_data[1] / fVar17) << 0x20;
      res_13.m_data[2] = (this->super_TriangleDerivateCase).m_coordMin.m_data[1];
      lVar8 = 1;
      do {
        res_3.m_data[lVar8] = *(float *)(&stack0xfffffffffffffd97 + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xd);
      fVar2 = (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
      local_1fc[0] = 0.0 / fVar18;
      local_1fc[1] = 0.0 / fVar17;
      local_1fc[2] = fVar2 + fVar2;
      res_13.m_data[0] = 0.0;
      res_13.m_data[1] = 0.0;
      stack0xfffffffffffffda0 = uVar5 & 0xffffffff00000000;
      lVar8 = 0;
      do {
        res_13.m_data[lVar8] = local_1fc[lVar8] * 0.5;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 2;
      do {
        res_3.m_data[lVar8] = *(float *)(&stack0xfffffffffffffd96 + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xe);
      fVar2 = (this->super_TriangleDerivateCase).m_coordMax.m_data[3];
      local_1fc[0] = -0.0 / fVar18;
      local_1fc[1] = -0.0 / fVar17;
      local_1fc[2] = fVar2 + fVar2;
      res_13.m_data[0] = 0.0;
      res_13.m_data[1] = 0.0;
      stack0xfffffffffffffda0 = stack0xfffffffffffffda0 & 0xffffffff00000000;
      lVar8 = 0;
      do {
        res_13.m_data[lVar8] = local_1fc[lVar8] * 0.5;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 3;
      do {
        res_3.m_data[lVar8] = *(float *)(&stack0xfffffffffffffd95 + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xf);
      bVar6 = reverifyConstantDerivateWithFlushRelaxations
                        (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,local_1f0,
                         (this->super_TriangleDerivateCase).m_dataType,
                         (this->super_TriangleDerivateCase).m_precision,scale,pVVar4,
                         &surfaceThreshold,
                         *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4,
                         (Linear2DFunctionEvaluator *)&res_3);
      iVar15 = (int)CONCAT71(extraout_var_00,bVar6);
    }
  }
  else {
    iVar15 = *(int *)(ctx + 8);
    iVar11 = *(int *)(ctx + 0xc);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      reference.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar8] -
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res.m_data[2] = 0.0;
    res.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      res.m_data[lVar8] = reference.m_data[lVar8] / (float)iVar15;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    res_3.m_data[2] = 0.0;
    res_3.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      res_3.m_data[lVar8] = res.m_data[lVar8] * xScale.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    opThreshold.m_data[0] = 0.0;
    opThreshold.m_data[1] = 0.0;
    opThreshold.m_data[2] = 0.0;
    opThreshold.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      opThreshold.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar8] -
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      reference.m_data[lVar8] = opThreshold.m_data[lVar8] / (float)iVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res.m_data[2] = 0.0;
    res.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      res.m_data[lVar8] = reference.m_data[lVar8] * yScale.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    opThreshold.m_data[0] = 0.0;
    opThreshold.m_data[1] = 0.0;
    opThreshold.m_data[2] = 0.0;
    opThreshold.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      fVar17 = res_3.m_data[lVar8];
      fVar18 = -fVar17;
      if (-fVar17 <= fVar17) {
        fVar18 = fVar17;
      }
      opThreshold.m_data[lVar8] = fVar18;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    threshold.m_data[0] = 0.0;
    threshold.m_data[1] = 0.0;
    threshold.m_data[2] = 0.0;
    threshold.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      fVar17 = res.m_data[lVar8];
      fVar18 = -fVar17;
      if (-fVar17 <= fVar17) {
        fVar18 = fVar17;
      }
      threshold.m_data[lVar8] = fVar18;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    reference.m_data[0] = 0.0;
    reference.m_data[1] = 0.0;
    reference.m_data[2] = 0.0;
    reference.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      reference.m_data[lVar8] = opThreshold.m_data[lVar8] + threshold.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    PVar3 = (this->super_TriangleDerivateCase).m_precision;
    threshold.m_data[0] = 0.0;
    threshold.m_data[1] = 0.0;
    threshold.m_data[2] = 0.0;
    threshold.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      threshold.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar8] * xScale.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res_8.m_data[0] = 0.0;
    res_8.m_data[1] = 0.0;
    lVar8 = 0;
    do {
      res_8.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar8] * xScale.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    getDerivateThreshold((Functional *)&opThreshold,PVar3,&threshold,(Vec4 *)&res_8,&res_3);
    res_8.m_data[0] = 0.0;
    res_8.m_data[1] = 0.0;
    lVar8 = 0;
    do {
      res_8.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar8] * yScale.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res_13.m_data[0] = 0.0;
    res_13.m_data[1] = 0.0;
    res_13.m_data[2] = 0.0;
    fStack_25c = 0.0;
    lVar8 = 0;
    do {
      res_13.m_data[lVar8] =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar8] * yScale.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    getDerivateThreshold((Functional *)&threshold,PVar3,(Vec4 *)&res_8,(Vec4 *)&res_13,&res);
    res_13.m_data[0] = 0.0;
    res_13.m_data[1] = 0.0;
    res_13.m_data[2] = 0.0;
    fStack_25c = 0.0;
    lVar8 = 0;
    do {
      uVar16 = -(uint)(threshold.m_data[lVar8] <= opThreshold.m_data[lVar8]);
      res_13.m_data[lVar8] =
           (float)(~uVar16 & (uint)threshold.m_data[lVar8] |
                  (uint)opThreshold.m_data[lVar8] & uVar16);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res_8.m_data[0] = 0.0;
    res_8.m_data[1] = 0.0;
    lVar8 = 0;
    do {
      uVar16 = -(uint)(res_13.m_data[lVar8] <= surfaceThreshold.m_data[lVar8]);
      res_8.m_data[lVar8] =
           (float)(~uVar16 & (uint)res_13.m_data[lVar8] |
                  (uint)surfaceThreshold.m_data[lVar8] & uVar16);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    bVar6 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                       (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                       &reference,(Vec4 *)&res_8,scale,
                       &(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
    iVar15 = (int)CONCAT71(extraout_var,bVar6);
  }
  return iVar15;
}

Assistant:

bool LinearDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_derivScale);

	if (m_func == DERIVATE_DFDX || m_func == DERIVATE_DFDY)
	{
		const bool			isX			= m_func == DERIVATE_DFDX;
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		const tcu::Vec4		reference	= ((m_coordMax - m_coordMin) / div) * scale;
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_precision, m_coordMin*scale, m_coordMax*scale, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_dataType);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								   reference, threshold, m_derivScale, m_derivBias,
								   LOG_NOTHING))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::IVec2			viewportSize	= getViewportSize();
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_coordMax - m_coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_coordMin.z() + m_coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_coordMax.w() + m_coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_testCtx.getLog(), result, errorMask,
																m_dataType, m_precision, m_derivScale,
																m_derivBias, surfaceThreshold, m_func,
																function);
		}
	}
	else
	{
		DE_ASSERT(m_func == DERIVATE_FWIDTH);
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_coordMax - m_coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_coordMax - m_coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_precision, m_coordMin*xScale, m_coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_precision, m_coordMin*yScale, m_coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
									  reference, threshold, m_derivScale, m_derivBias);
	}
}